

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this,uint64 *value)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint local_38;
  uint local_34;
  uint32 part2;
  uint32 part1;
  uint32 part0;
  uint32 b;
  uint8 *ptr;
  uint64 *value_local;
  CodedInputStream *this_local;
  
  iVar3 = BufferSize(this);
  if ((iVar3 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    this_local._7_1_ = ReadVarint64Slow(this,value);
  }
  else {
    pbVar2 = this->buffer_;
    local_34 = 0;
    local_38 = 0;
    _part0 = pbVar2 + 1;
    part2 = *pbVar2 & 0x7f;
    if ((*pbVar2 & 0x80) != 0) {
      bVar1 = *_part0;
      part2 = (bVar1 & 0x7f) << 7 | part2;
      _part0 = pbVar2 + 2;
      if ((bVar1 & 0x80) != 0) {
        bVar1 = pbVar2[2];
        part2 = (bVar1 & 0x7f) << 0xe | part2;
        _part0 = pbVar2 + 3;
        if ((bVar1 & 0x80) != 0) {
          bVar1 = pbVar2[3];
          part2 = (bVar1 & 0x7f) << 0x15 | part2;
          _part0 = pbVar2 + 4;
          if ((bVar1 & 0x80) != 0) {
            bVar1 = pbVar2[4];
            local_34 = bVar1 & 0x7f;
            _part0 = pbVar2 + 5;
            if ((bVar1 & 0x80) != 0) {
              bVar1 = pbVar2[5];
              local_34 = (bVar1 & 0x7f) << 7 | local_34;
              _part0 = pbVar2 + 6;
              if ((bVar1 & 0x80) != 0) {
                bVar1 = pbVar2[6];
                local_34 = (bVar1 & 0x7f) << 0xe | local_34;
                _part0 = pbVar2 + 7;
                if ((bVar1 & 0x80) != 0) {
                  bVar1 = pbVar2[7];
                  local_34 = (bVar1 & 0x7f) << 0x15 | local_34;
                  _part0 = pbVar2 + 8;
                  if ((bVar1 & 0x80) != 0) {
                    bVar1 = pbVar2[8];
                    local_38 = bVar1 & 0x7f;
                    _part0 = pbVar2 + 9;
                    if ((bVar1 & 0x80) != 0) {
                      bVar1 = pbVar2[9];
                      local_38 = (bVar1 & 0x7f) << 7 | local_38;
                      _part0 = pbVar2 + 10;
                      if ((bVar1 & 0x80) != 0) {
                        return false;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Advance(this,(int)_part0 - (int)this->buffer_);
    *value = (ulong)part2 | (ulong)local_34 << 0x1c | (ulong)local_38 << 0x38;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::ReadVarint64Fallback(uint64* value) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  If the varint ends at exactly the end of the buffer,
      // we can detect that and still use the fast path.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this read won't cross the end, so we can skip the checks.

    const uint8* ptr = buffer_;
    uint32 b;

    // Splitting into 32-bit pieces gives better performance on 32-bit
    // processors.
    uint32 part0 = 0, part1 = 0, part2 = 0;

    b = *(ptr++); part0  = (b & 0x7F)      ; if (!(b & 0x80)) goto done;
    b = *(ptr++); part0 |= (b & 0x7F) <<  7; if (!(b & 0x80)) goto done;
    b = *(ptr++); part0 |= (b & 0x7F) << 14; if (!(b & 0x80)) goto done;
    b = *(ptr++); part0 |= (b & 0x7F) << 21; if (!(b & 0x80)) goto done;
    b = *(ptr++); part1  = (b & 0x7F)      ; if (!(b & 0x80)) goto done;
    b = *(ptr++); part1 |= (b & 0x7F) <<  7; if (!(b & 0x80)) goto done;
    b = *(ptr++); part1 |= (b & 0x7F) << 14; if (!(b & 0x80)) goto done;
    b = *(ptr++); part1 |= (b & 0x7F) << 21; if (!(b & 0x80)) goto done;
    b = *(ptr++); part2  = (b & 0x7F)      ; if (!(b & 0x80)) goto done;
    b = *(ptr++); part2 |= (b & 0x7F) <<  7; if (!(b & 0x80)) goto done;

    // We have overrun the maximum size of a varint (10 bytes).  The data
    // must be corrupt.
    return false;

   done:
    Advance(ptr - buffer_);
    *value = (static_cast<uint64>(part0)      ) |
             (static_cast<uint64>(part1) << 28) |
             (static_cast<uint64>(part2) << 56);
    return true;
  } else {
    return ReadVarint64Slow(value);
  }
}